

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::cmTarget(cmTarget *this,string *name,TargetType type,Visibility vis,cmMakefile *mf)

{
  cmMakefile *pcVar1;
  pointer pbVar2;
  bool bVar3;
  int iVar4;
  TargetType TVar5;
  string *psVar6;
  char *pcVar7;
  cmGlobalGenerator *pcVar8;
  uint uVar9;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var10;
  pointer pbVar11;
  long lVar12;
  string configUpper;
  anon_class_24_3_0d5b69a6 initProp;
  string property;
  string defKey;
  anon_class_24_3_0d5b69a6 initPropValue;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configNames;
  string propValue;
  string local_50;
  
  std::make_unique<cmTargetInternals>();
  if (mf == (cmMakefile *)0x0) {
    __assert_fail("mf",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmTarget.cxx"
                  ,0xd5,
                  "cmTarget::cmTarget(const std::string &, cmStateEnums::TargetType, Visibility, cmMakefile *)"
                 );
  }
  _Var10._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  (_Var10._M_head_impl)->TargetType = type;
  (_Var10._M_head_impl)->Makefile = mf;
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Name);
  _Var10._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  (_Var10._M_head_impl)->IsGeneratorProvided = false;
  (_Var10._M_head_impl)->HaveInstallRule = false;
  (_Var10._M_head_impl)->DLLPlatform = false;
  (_Var10._M_head_impl)->IsAndroid = false;
  (_Var10._M_head_impl)->IsImportedTarget = vis - VisibilityImported < 2;
  (_Var10._M_head_impl)->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  (_Var10._M_head_impl)->BuildInterfaceIncludesAppended = false;
  pcVar1 = (_Var10._M_head_impl)->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defKey,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator<char> *)&configUpper);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&defKey);
  ((this->impl)._M_t.
   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
   super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->DLLPlatform =
       psVar6->_M_string_length != 0;
  std::__cxx11::string::~string((string *)&defKey);
  pcVar1 = ((this->impl)._M_t.
            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
            super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defKey,"CMAKE_SYSTEM_NAME",(allocator<char> *)&configUpper);
  psVar6 = cmMakefile::GetSafeDefinition(pcVar1,&defKey);
  bVar3 = std::operator==(psVar6,"Android");
  ((this->impl)._M_t.
   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
   super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsAndroid = bVar3;
  std::__cxx11::string::~string((string *)&defKey);
  defKey._M_dataplus._M_p = (pointer)&defKey.field_2;
  defKey._M_string_length = 0;
  defKey.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)&defKey);
  std::__cxx11::string::append((char *)&defKey);
  uVar9 = ((this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  initProp.this = this;
  initProp.mf = mf;
  initProp.defKey = &defKey;
  initPropValue.this = this;
  initPropValue.mf = mf;
  initPropValue.defKey = &defKey;
  if ((uVar9 | 2) != 7) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_API",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_API_MIN",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_ARCH",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_STL_TYPE",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_SKIP_ANT_STEP",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_PROCESS_MAX",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_PROGUARD",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_PROGUARD_CONFIG_PATH",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_SECURE_PROPS_PATH",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_NATIVE_LIB_DIRECTORIES",(allocator<char> *)&property)
    ;
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_NATIVE_LIB_DEPENDENCIES",(allocator<char> *)&property
              );
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_JAVA_SOURCE_DIR",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_JAR_DIRECTORIES",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_JAR_DEPENDENCIES",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_ASSETS_DIRECTORIES",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ANDROID_ANT_ADDITIONAL_OPTIONS",(allocator<char> *)&property)
    ;
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"BUILD_RPATH",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"BUILD_RPATH_USE_ORIGIN",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"INSTALL_NAME_DIR",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"INSTALL_RPATH",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&configUpper,"");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"INSTALL_RPATH_USE_LINK_PATH",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&configUpper,"OFF");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"INTERPROCEDURAL_OPTIMIZATION",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"SKIP_BUILD_RPATH",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&configUpper,"OFF");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"BUILD_WITH_INSTALL_RPATH",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initPropValue,&configUpper,"OFF");
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"ARCHIVE_OUTPUT_DIRECTORY",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LIBRARY_OUTPUT_DIRECTORY",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"RUNTIME_OUTPUT_DIRECTORY",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"PDB_OUTPUT_DIRECTORY",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"COMPILE_PDB_OUTPUT_DIRECTORY",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"FRAMEWORK",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"Fortran_FORMAT",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"Fortran_MODULE_DIRECTORY",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"Fortran_COMPILER_LAUNCHER",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"GNUtoMS",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"OSX_ARCHITECTURES",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"IOS_INSTALL_COMBINED",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOMOC",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOUIC",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTORCC",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOGEN_ORIGIN_DEPENDS",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOGEN_PARALLEL",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOMOC_COMPILER_PREDEFINES",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOMOC_DEPEND_FILTERS",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOMOC_MACRO_NAMES",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOMOC_MOC_OPTIONS",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOUIC_OPTIONS",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTOUIC_SEARCH_PATHS",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"AUTORCC_OPTIONS",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LINK_DEPENDS_NO_SHARED",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LINK_INTERFACE_LIBRARIES",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"MSVC_RUNTIME_LIBRARY",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"WIN32_EXECUTABLE",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"MACOSX_BUNDLE",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"MACOSX_RPATH",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"NO_SYSTEM_FROM_IMPORTED",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"BUILD_WITH_INSTALL_NAME_DIR",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_CLANG_TIDY",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_COMPILER_LAUNCHER",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_CPPLINT",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_CPPCHECK",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_INCLUDE_WHAT_YOU_USE",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LINK_WHAT_YOU_USE",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_STANDARD",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_STANDARD_REQUIRED",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_EXTENSIONS",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_CLANG_TIDY",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_COMPILER_LAUNCHER",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_CPPLINT",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_CPPCHECK",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_INCLUDE_WHAT_YOU_USE",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_STANDARD",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_STANDARD_REQUIRED",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_EXTENSIONS",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_STANDARD",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_STANDARD_REQUIRED",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_EXTENSIONS",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_COMPILER_LAUNCHER",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_SEPARABLE_COMPILATION",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LINK_SEARCH_START_STATIC",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"LINK_SEARCH_END_STATIC",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"FOLDER",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"Swift_MODULE_DIRECTORY",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"VS_JUST_MY_CODE_DEBUGGING",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    uVar9 = ((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  }
  if (uVar9 != 5) {
    configNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    configNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    configNames.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    cmMakefile::GetConfigurations(&local_50,mf,&configNames,true);
    std::__cxx11::string::~string((string *)&local_50);
    pbVar2 = configNames.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar11 = configNames.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
        pbVar11 = pbVar11 + 1) {
      cmsys::SystemTools::UpperCase(&configUpper,pbVar11);
      for (lVar12 = 0; lVar12 != 0x38; lVar12 = lVar12 + 8) {
        pcVar7 = *(char **)((long)&cmTarget(std::__cxx11::string_const&,cmStateEnums::TargetType,cmTarget::Visibility,cmMakefile*)
                                   ::configProps + lVar12);
        if (((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType == 7) {
          iVar4 = strcmp(pcVar7,"MAP_IMPORTED_CONFIG_");
          if (iVar4 == 0) goto LAB_001d1f44;
        }
        else {
LAB_001d1f44:
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&property,pcVar7,(allocator<char> *)&propValue);
          std::__cxx11::string::append((string *)&property);
          cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&property);
          std::__cxx11::string::~string((string *)&property);
        }
      }
      iVar4 = ((this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
      if ((iVar4 != 0) && (iVar4 != 7)) {
        cmsys::SystemTools::UpperCase(&property,pbVar11);
        std::__cxx11::string::append((char *)&property);
        cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&property);
        std::__cxx11::string::~string((string *)&property);
      }
      std::__cxx11::string::~string((string *)&configUpper);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&configNames);
  }
  cmMakefile::GetBacktrace((cmMakefile *)&configUpper);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &((this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Backtrace,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             &configUpper);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&configUpper._M_string_length);
  _Var10._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  if ((_Var10._M_head_impl)->IsImportedTarget == false) {
    configUpper._0_16_ =
         cmMakefile::GetIncludeDirectoriesEntries_abi_cxx11_((_Var10._M_head_impl)->Makefile);
    cmAppend<std::__cxx11::string,cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&(_Var10._M_head_impl)->IncludeDirectoriesEntries,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    configUpper._0_16_ =
         cmMakefile::GetIncludeDirectoriesBacktraces((_Var10._M_head_impl)->Makefile);
    cmAppend<cmListFileBacktrace,cmRange<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>>
              (&(_Var10._M_head_impl)->IncludeDirectoriesBacktraces,
               (cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    pcVar1 = (_Var10._M_head_impl)->Makefile;
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_range_unique<std::_Rb_tree_const_iterator<std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(_Var10._M_head_impl)->SystemIncludeDirectories,
               (pcVar1->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header._M_header.
               _M_left,&(pcVar1->SystemIncludeDirectories)._M_t._M_impl.super__Rb_tree_header.
                        _M_header);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    configUpper._0_16_ =
         cmMakefile::GetCompileOptionsEntries_abi_cxx11_((_Var10._M_head_impl)->Makefile);
    cmAppend<std::__cxx11::string,cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&(_Var10._M_head_impl)->CompileOptionsEntries,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    configUpper._0_16_ = cmMakefile::GetCompileOptionsBacktraces((_Var10._M_head_impl)->Makefile);
    cmAppend<cmListFileBacktrace,cmRange<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>>
              (&(_Var10._M_head_impl)->CompileOptionsBacktraces,
               (cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    configUpper._0_16_ =
         cmMakefile::GetLinkOptionsEntries_abi_cxx11_((_Var10._M_head_impl)->Makefile);
    cmAppend<std::__cxx11::string,cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&(_Var10._M_head_impl)->LinkOptionsEntries,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    configUpper._0_16_ = cmMakefile::GetLinkOptionsBacktraces((_Var10._M_head_impl)->Makefile);
    cmAppend<cmListFileBacktrace,cmRange<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>>
              (&(_Var10._M_head_impl)->LinkOptionsBacktraces,
               (cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    configUpper._0_16_ =
         cmMakefile::GetLinkDirectoriesEntries_abi_cxx11_((_Var10._M_head_impl)->Makefile);
    cmAppend<std::__cxx11::string,cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&(_Var10._M_head_impl)->LinkDirectoriesEntries,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    configUpper._0_16_ = cmMakefile::GetLinkDirectoriesBacktraces((_Var10._M_head_impl)->Makefile);
    cmAppend<cmListFileBacktrace,cmRange<__gnu_cxx::__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>>>
              (&(_Var10._M_head_impl)->LinkDirectoriesBacktraces,
               (cmRange<__gnu_cxx::__normal_iterator<const_cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>_>
                *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  TVar5 = (_Var10._M_head_impl)->TargetType;
  if ((TVar5 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"C_VISIBILITY_PRESET",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CXX_VISIBILITY_PRESET",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CUDA_VISIBILITY_PRESET",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"VISIBILITY_INLINES_HIDDEN",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    TVar5 = (_Var10._M_head_impl)->TargetType;
    if (TVar5 == EXECUTABLE) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&configUpper,"ANDROID_GUI",(allocator<char> *)&property);
      cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&configUpper,"CROSSCOMPILING_EMULATOR",(allocator<char> *)&property);
      cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
      std::__cxx11::string::~string((string *)&configUpper);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&configUpper,"ENABLE_EXPORTS",(allocator<char> *)&property);
      cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
      std::__cxx11::string::~string((string *)&configUpper);
      _Var10._M_head_impl =
           (this->impl)._M_t.
           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
           super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
      TVar5 = (_Var10._M_head_impl)->TargetType;
    }
  }
  if ((TVar5 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"POSITION_INDEPENDENT_CODE",(allocator<char> *)&property);
    SetProperty(this,&configUpper,"True");
    std::__cxx11::string::~string((string *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    TVar5 = (_Var10._M_head_impl)->TargetType;
  }
  if ((TVar5 & ~SHARED_LIBRARY) == EXECUTABLE) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"WINDOWS_EXPORT_ALL_SYMBOLS",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
    TVar5 = (_Var10._M_head_impl)->TargetType;
  }
  if ((TVar5 | SHARED_LIBRARY) != INTERFACE_LIBRARY) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"POSITION_INDEPENDENT_CODE",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    _Var10._M_head_impl =
         (this->impl)._M_t.
         super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
         super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
         super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  }
  cmMakefile::RecordPolicies((_Var10._M_head_impl)->Makefile,&(_Var10._M_head_impl)->PolicyMap);
  _Var10._M_head_impl =
       (this->impl)._M_t.
       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
       super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
  uVar9 = (_Var10._M_head_impl)->TargetType;
  if (uVar9 == 7) {
    cmPolicies::PolicyMap::Set(&(_Var10._M_head_impl)->PolicyMap,CMP0022,NEW);
    uVar9 = ((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  }
  if ((uVar9 | 2) != 7) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"JOB_POOL_COMPILE",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"JOB_POOL_LINK",(allocator<char> *)&property);
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    uVar9 = ((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  }
  if ((int)uVar9 < 6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"DOTNET_TARGET_FRAMEWORK_VERSION",(allocator<char> *)&property
              );
    cmTarget::anon_class_24_3_0d5b69a6::operator()(&initProp,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    uVar9 = ((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType;
  }
  if ((uVar9 | 2) != 7) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&configUpper,"CMAKE_VS_GLOBALS",(allocator<char> *)&property);
    pcVar7 = cmMakefile::GetDefinition(mf,&configUpper);
    std::__cxx11::string::~string((string *)&configUpper);
    if (pcVar7 != (char *)0x0) {
      pcVar8 = cmMakefile::GetGlobalGenerator(mf);
      (*pcVar8->_vptr_cmGlobalGenerator[3])(&configUpper,pcVar8);
      bVar3 = cmHasLiteralPrefix<std::__cxx11::string,14ul>
                        (&configUpper,(char (*) [14])"Visual Studio");
      if (bVar3) {
        props.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        props.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        props.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&property,pcVar7,(allocator<char> *)&configNames);
        cmSystemTools::ExpandListArgument(&property,&props,false);
        std::__cxx11::string::~string((string *)&property);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&property,"VS_GLOBAL_",(allocator<char> *)&configNames);
        pbVar2 = props.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar11 = props.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar2;
            pbVar11 = pbVar11 + 1) {
          lVar12 = std::__cxx11::string::find((char)pbVar11,0x3d);
          if (lVar12 != -1) {
            std::__cxx11::string::substr((ulong)&propValue,(ulong)pbVar11);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &configNames,&property,&propValue);
            std::__cxx11::string::~string((string *)&propValue);
            std::__cxx11::string::substr((ulong)&propValue,(ulong)pbVar11);
            cmTarget::anon_class_24_3_0d5b69a6::operator()
                      (&initPropValue,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &configNames,propValue._M_dataplus._M_p);
            std::__cxx11::string::~string((string *)&propValue);
            std::__cxx11::string::~string((string *)&configNames);
          }
        }
        std::__cxx11::string::~string((string *)&property);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&props);
      }
      std::__cxx11::string::~string((string *)&configUpper);
    }
  }
  std::__cxx11::string::~string((string *)&defKey);
  return;
}

Assistant:

cmTarget::cmTarget(std::string const& name, cmStateEnums::TargetType type,
                   Visibility vis, cmMakefile* mf)
  : impl(cm::make_unique<cmTargetInternals>())
{
  assert(mf);
  impl->TargetType = type;
  impl->Makefile = mf;
  impl->Name = name;
  impl->IsGeneratorProvided = false;
  impl->HaveInstallRule = false;
  impl->DLLPlatform = false;
  impl->IsAndroid = false;
  impl->IsImportedTarget =
    (vis == VisibilityImported || vis == VisibilityImportedGlobally);
  impl->ImportedGloballyVisible = vis == VisibilityImportedGlobally;
  impl->BuildInterfaceIncludesAppended = false;

  // Check whether this is a DLL platform.
  impl->DLLPlatform =
    !impl->Makefile->GetSafeDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX").empty();

  // Check whether we are targeting an Android platform.
  impl->IsAndroid =
    (impl->Makefile->GetSafeDefinition("CMAKE_SYSTEM_NAME") == "Android");

  std::string defKey;
  defKey.reserve(128);
  defKey += "CMAKE_";
  auto initProp = [this, mf, &defKey](const std::string& property) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (const char* value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    }
  };
  auto initPropValue = [this, mf, &defKey](const std::string& property,
                                           const char* default_value) {
    // Replace everything after "CMAKE_"
    defKey.replace(defKey.begin() + 6, defKey.end(), property);
    if (const char* value = mf->GetDefinition(defKey)) {
      this->SetProperty(property, value);
    } else if (default_value) {
      this->SetProperty(property, default_value);
    }
  };

  // Setup default property values.
  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("ANDROID_API");
    initProp("ANDROID_API_MIN");
    initProp("ANDROID_ARCH");
    initProp("ANDROID_STL_TYPE");
    initProp("ANDROID_SKIP_ANT_STEP");
    initProp("ANDROID_PROCESS_MAX");
    initProp("ANDROID_PROGUARD");
    initProp("ANDROID_PROGUARD_CONFIG_PATH");
    initProp("ANDROID_SECURE_PROPS_PATH");
    initProp("ANDROID_NATIVE_LIB_DIRECTORIES");
    initProp("ANDROID_NATIVE_LIB_DEPENDENCIES");
    initProp("ANDROID_JAVA_SOURCE_DIR");
    initProp("ANDROID_JAR_DIRECTORIES");
    initProp("ANDROID_JAR_DEPENDENCIES");
    initProp("ANDROID_ASSETS_DIRECTORIES");
    initProp("ANDROID_ANT_ADDITIONAL_OPTIONS");
    initProp("BUILD_RPATH");
    initProp("BUILD_RPATH_USE_ORIGIN");
    initProp("INSTALL_NAME_DIR");
    initPropValue("INSTALL_RPATH", "");
    initPropValue("INSTALL_RPATH_USE_LINK_PATH", "OFF");
    initProp("INTERPROCEDURAL_OPTIMIZATION");
    initPropValue("SKIP_BUILD_RPATH", "OFF");
    initPropValue("BUILD_WITH_INSTALL_RPATH", "OFF");
    initProp("ARCHIVE_OUTPUT_DIRECTORY");
    initProp("LIBRARY_OUTPUT_DIRECTORY");
    initProp("RUNTIME_OUTPUT_DIRECTORY");
    initProp("PDB_OUTPUT_DIRECTORY");
    initProp("COMPILE_PDB_OUTPUT_DIRECTORY");
    initProp("FRAMEWORK");
    initProp("Fortran_FORMAT");
    initProp("Fortran_MODULE_DIRECTORY");
    initProp("Fortran_COMPILER_LAUNCHER");
    initProp("GNUtoMS");
    initProp("OSX_ARCHITECTURES");
    initProp("IOS_INSTALL_COMBINED");
    initProp("AUTOMOC");
    initProp("AUTOUIC");
    initProp("AUTORCC");
    initProp("AUTOGEN_ORIGIN_DEPENDS");
    initProp("AUTOGEN_PARALLEL");
    initProp("AUTOMOC_COMPILER_PREDEFINES");
    initProp("AUTOMOC_DEPEND_FILTERS");
    initProp("AUTOMOC_MACRO_NAMES");
    initProp("AUTOMOC_MOC_OPTIONS");
    initProp("AUTOUIC_OPTIONS");
    initProp("AUTOUIC_SEARCH_PATHS");
    initProp("AUTORCC_OPTIONS");
    initProp("LINK_DEPENDS_NO_SHARED");
    initProp("LINK_INTERFACE_LIBRARIES");
    initProp("MSVC_RUNTIME_LIBRARY");
    initProp("WIN32_EXECUTABLE");
    initProp("MACOSX_BUNDLE");
    initProp("MACOSX_RPATH");
    initProp("NO_SYSTEM_FROM_IMPORTED");
    initProp("BUILD_WITH_INSTALL_NAME_DIR");
    initProp("C_CLANG_TIDY");
    initProp("C_COMPILER_LAUNCHER");
    initProp("C_CPPLINT");
    initProp("C_CPPCHECK");
    initProp("C_INCLUDE_WHAT_YOU_USE");
    initProp("LINK_WHAT_YOU_USE");
    initProp("C_STANDARD");
    initProp("C_STANDARD_REQUIRED");
    initProp("C_EXTENSIONS");
    initProp("CXX_CLANG_TIDY");
    initProp("CXX_COMPILER_LAUNCHER");
    initProp("CXX_CPPLINT");
    initProp("CXX_CPPCHECK");
    initProp("CXX_INCLUDE_WHAT_YOU_USE");
    initProp("CXX_STANDARD");
    initProp("CXX_STANDARD_REQUIRED");
    initProp("CXX_EXTENSIONS");
    initProp("CUDA_STANDARD");
    initProp("CUDA_STANDARD_REQUIRED");
    initProp("CUDA_EXTENSIONS");
    initProp("CUDA_COMPILER_LAUNCHER");
    initProp("CUDA_SEPARABLE_COMPILATION");
    initProp("LINK_SEARCH_START_STATIC");
    initProp("LINK_SEARCH_END_STATIC");
    initProp("FOLDER");
    initProp("Swift_MODULE_DIRECTORY");
    initProp("VS_JUST_MY_CODE_DEBUGGING");
#ifdef __APPLE__
    if (this->GetGlobalGenerator()->IsXcode()) {
      initProp("XCODE_GENERATE_SCHEME");
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER");
      initProp("XCODE_SCHEME_ADDRESS_SANITIZER_USE_AFTER_RETURN");
      initProp("XCODE_SCHEME_THREAD_SANITIZER");
      initProp("XCODE_SCHEME_THREAD_SANITIZER_STOP");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER");
      initProp("XCODE_SCHEME_UNDEFINED_BEHAVIOUR_SANITIZER_STOP");
      initProp("XCODE_SCHEME_DISABLE_MAIN_THREAD_CHECKER");
      initProp("XCODE_SCHEME_MAIN_THREAD_CHECKER_STOP");
      initProp("XCODE_SCHEME_MALLOC_SCRIBBLE");
      initProp("XCODE_SCHEME_MALLOC_GUARD_EDGES");
      initProp("XCODE_SCHEME_GUARD_MALLOC");
      initProp("XCODE_SCHEME_ZOMBIE_OBJECTS");
      initProp("XCODE_SCHEME_MALLOC_STACK");
      initProp("XCODE_SCHEME_DYNAMIC_LINKER_API_USAGE");
      initProp("XCODE_SCHEME_DYNAMIC_LIBRARY_LOADS");
    }
#endif
  }

  // Setup per-configuration property default values.
  if (this->GetType() != cmStateEnums::UTILITY) {
    static const auto configProps = {
      /* clang-format needs this comment to break after the opening brace */
      "ARCHIVE_OUTPUT_DIRECTORY_",     "LIBRARY_OUTPUT_DIRECTORY_",
      "RUNTIME_OUTPUT_DIRECTORY_",     "PDB_OUTPUT_DIRECTORY_",
      "COMPILE_PDB_OUTPUT_DIRECTORY_", "MAP_IMPORTED_CONFIG_",
      "INTERPROCEDURAL_OPTIMIZATION_"
    };
    // Collect the set of configuration types.
    std::vector<std::string> configNames;
    mf->GetConfigurations(configNames);
    for (std::string const& configName : configNames) {
      std::string configUpper = cmSystemTools::UpperCase(configName);
      for (auto const& prop : configProps) {
        // Interface libraries have no output locations, so honor only
        // the configuration map.
        if (impl->TargetType == cmStateEnums::INTERFACE_LIBRARY &&
            strcmp(prop, "MAP_IMPORTED_CONFIG_") != 0) {
          continue;
        }
        std::string property = prop;
        property += configUpper;
        initProp(property);
      }

      // Initialize per-configuration name postfix property from the
      // variable only for non-executable targets.  This preserves
      // compatibility with previous CMake versions in which executables
      // did not support this variable.  Projects may still specify the
      // property directly.
      if (impl->TargetType != cmStateEnums::EXECUTABLE &&
          impl->TargetType != cmStateEnums::INTERFACE_LIBRARY) {
        std::string property = cmSystemTools::UpperCase(configName);
        property += "_POSTFIX";
        initProp(property);
      }
    }
  }

  // Save the backtrace of target construction.
  impl->Backtrace = impl->Makefile->GetBacktrace();

  if (!this->IsImported()) {
    // Initialize the INCLUDE_DIRECTORIES property based on the current value
    // of the same directory property:
    cmAppend(impl->IncludeDirectoriesEntries,
             impl->Makefile->GetIncludeDirectoriesEntries());
    cmAppend(impl->IncludeDirectoriesBacktraces,
             impl->Makefile->GetIncludeDirectoriesBacktraces());

    {
      auto const& sysInc = impl->Makefile->GetSystemIncludeDirectories();
      impl->SystemIncludeDirectories.insert(sysInc.begin(), sysInc.end());
    }

    cmAppend(impl->CompileOptionsEntries,
             impl->Makefile->GetCompileOptionsEntries());
    cmAppend(impl->CompileOptionsBacktraces,
             impl->Makefile->GetCompileOptionsBacktraces());

    cmAppend(impl->LinkOptionsEntries,
             impl->Makefile->GetLinkOptionsEntries());
    cmAppend(impl->LinkOptionsBacktraces,
             impl->Makefile->GetLinkOptionsBacktraces());

    cmAppend(impl->LinkDirectoriesEntries,
             impl->Makefile->GetLinkDirectoriesEntries());
    cmAppend(impl->LinkDirectoriesBacktraces,
             impl->Makefile->GetLinkDirectoriesBacktraces());
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("C_VISIBILITY_PRESET");
    initProp("CXX_VISIBILITY_PRESET");
    initProp("CUDA_VISIBILITY_PRESET");
    initProp("VISIBILITY_INLINES_HIDDEN");
  }

  if (impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("ANDROID_GUI");
    initProp("CROSSCOMPILING_EMULATOR");
    initProp("ENABLE_EXPORTS");
  }
  if (impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      impl->TargetType == cmStateEnums::MODULE_LIBRARY) {
    this->SetProperty("POSITION_INDEPENDENT_CODE", "True");
  }
  if (impl->TargetType == cmStateEnums::SHARED_LIBRARY ||
      impl->TargetType == cmStateEnums::EXECUTABLE) {
    initProp("WINDOWS_EXPORT_ALL_SYMBOLS");
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("POSITION_INDEPENDENT_CODE");
  }

  // Record current policies for later use.
  impl->Makefile->RecordPolicies(impl->PolicyMap);

  if (impl->TargetType == cmStateEnums::INTERFACE_LIBRARY) {
    // This policy is checked in a few conditions. The properties relevant
    // to the policy are always ignored for cmStateEnums::INTERFACE_LIBRARY
    // targets,
    // so ensure that the conditions don't lead to nonsense.
    impl->PolicyMap.Set(cmPolicies::CMP0022, cmPolicies::NEW);
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {
    initProp("JOB_POOL_COMPILE");
    initProp("JOB_POOL_LINK");
  }

  if (impl->TargetType <= cmStateEnums::UTILITY) {
    initProp("DOTNET_TARGET_FRAMEWORK_VERSION");
  }

  if (this->GetType() != cmStateEnums::INTERFACE_LIBRARY &&
      this->GetType() != cmStateEnums::UTILITY) {

    // check for "CMAKE_VS_GLOBALS" variable and set up target properties
    // if any
    const char* globals = mf->GetDefinition("CMAKE_VS_GLOBALS");
    if (globals) {
      const std::string genName = mf->GetGlobalGenerator()->GetName();
      if (cmHasLiteralPrefix(genName, "Visual Studio")) {
        std::vector<std::string> props;
        cmSystemTools::ExpandListArgument(globals, props);
        const std::string vsGlobal = "VS_GLOBAL_";
        for (const std::string& i : props) {
          // split NAME=VALUE
          const std::string::size_type assignment = i.find('=');
          if (assignment != std::string::npos) {
            const std::string propName = vsGlobal + i.substr(0, assignment);
            const std::string propValue = i.substr(assignment + 1);
            initPropValue(propName, propValue.c_str());
          }
        }
      }
    }
  }
}